

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockNameLengthContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  Node *pNVar1;
  allocator<char> local_41;
  string local_40;
  
  pNVar1 = parentStructure->m_ptr;
  if ((pNVar1->m_type == TYPE_INTERFACE_BLOCK) &&
     ((*(char *)&pNVar1[1]._vptr_Node != '\x01' ||
      (((pNVar1->m_enclosingNode).m_ptr)->m_type == TYPE_ARRAY_ELEMENT)))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,SSBOArrayLengthTests::init::arraysSized + 1,&local_41);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,targetGroup,PROGRAMINTERFACE_UNIFORM,
               PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_40,1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,SSBOArrayLengthTests::init::arraysSized + 1,&local_41);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,targetGroup,PROGRAMINTERFACE_UNIFORM,
               PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_40,2);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void generateUniformBlockNameLengthContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const bool	isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool	namedNonArrayBlock	= isInterfaceBlock																					&&
									  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
									  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 2);
	else
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 1);
}